

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

void Assimp::Q3Shader::ConvertShaderToMaterial(aiMaterial *out,ShaderDataBlock *shader)

{
  bool bVar1;
  reference pSVar2;
  undefined1 local_468 [8];
  aiColor3D one;
  int use_alpha;
  int blend;
  int additive;
  uint local_444;
  uint local_440;
  uint index;
  aiTextureType type;
  aiString s;
  _Self local_30;
  const_iterator it;
  uint cur_lm;
  uint cur_diffuse;
  uint cur_emissive;
  int twosided;
  ShaderDataBlock *shader_local;
  aiMaterial *out_local;
  
  _cur_emissive = shader;
  shader_local = (ShaderDataBlock *)out;
  if (out != (aiMaterial *)0x0) {
    if (shader->cull == CULL_NONE) {
      cur_diffuse = 1;
      aiMaterial::AddProperty(out,(int *)&cur_diffuse,1,"$mat.twosided",0,0);
    }
    cur_lm = 0;
    it._M_node._4_4_ = 0;
    it._M_node._0_4_ = 0;
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>::
         begin(&_cur_emissive->maps);
    while( true ) {
      s.data._1016_8_ =
           std::__cxx11::
           list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
           ::end(&_cur_emissive->maps);
      bVar1 = std::operator!=(&local_30,(_Self *)(s.data + 0x3f8));
      if (!bVar1) break;
      pSVar2 = std::_List_const_iterator<Assimp::Q3Shader::ShaderMapBlock>::operator*(&local_30);
      aiString::aiString((aiString *)&index,&pSVar2->name);
      pSVar2 = std::_List_const_iterator<Assimp::Q3Shader::ShaderMapBlock>::operator*(&local_30);
      if ((pSVar2->blend_src == BLEND_GL_ONE) &&
         (pSVar2 = std::_List_const_iterator<Assimp::Q3Shader::ShaderMapBlock>::operator*(&local_30)
         , pSVar2->blend_dest == BLEND_GL_ONE)) {
        _blend = std::__cxx11::
                 list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
                 ::begin(&_cur_emissive->maps);
        bVar1 = std::operator==(&local_30,(_Self *)&blend);
        if (bVar1) {
          use_alpha = 1;
          aiMaterial::AddProperty((aiMaterial *)shader_local,&use_alpha,1,"$mat.blend",0,0);
          local_444 = it._M_node._4_4_;
          local_440 = 1;
          it._M_node._4_4_ = it._M_node._4_4_ + 1;
        }
        else {
          local_444 = cur_lm;
          local_440 = 4;
          cur_lm = cur_lm + 1;
        }
      }
      else {
        pSVar2 = std::_List_const_iterator<Assimp::Q3Shader::ShaderMapBlock>::operator*(&local_30);
        if ((pSVar2->blend_src == BLEND_GL_DST_COLOR) &&
           (pSVar2 = std::_List_const_iterator<Assimp::Q3Shader::ShaderMapBlock>::operator*
                               (&local_30), pSVar2->blend_dest == BLEND_GL_ZERO)) {
          local_444 = (uint)it._M_node;
          local_440 = 10;
          it._M_node._0_4_ = (uint)it._M_node + 1;
        }
        else {
          one.b = 0.0;
          aiMaterial::AddProperty((aiMaterial *)shader_local,(int *)&one.b,1,"$mat.blend",0,0);
          local_444 = it._M_node._4_4_;
          local_440 = 1;
          it._M_node._4_4_ = it._M_node._4_4_ + 1;
        }
      }
      aiMaterial::AddProperty
                ((aiMaterial *)shader_local,(aiString *)&index,"$tex.file",local_440,local_444);
      pSVar2 = std::_List_const_iterator<Assimp::Q3Shader::ShaderMapBlock>::operator*(&local_30);
      one.g = 5.60519e-45;
      if (pSVar2->alpha_test != AT_NONE) {
        one.g = 2.8026e-45;
      }
      aiMaterial::AddProperty
                ((aiMaterial *)shader_local,(int *)&one.g,1,"$tex.flags",local_440,local_444);
      std::_List_const_iterator<Assimp::Q3Shader::ShaderMapBlock>::operator++(&local_30);
    }
    if (cur_lm != 0) {
      aiColor3D::aiColor3D((aiColor3D *)local_468,1.0,1.0,1.0);
      aiMaterial::AddProperty
                ((aiMaterial *)shader_local,(aiColor3D *)local_468,1,"$clr.emissive",0,0);
    }
    return;
  }
  __assert_fail("__null != out",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MD3/MD3Loader.cpp"
                ,0x113,
                "void Assimp::Q3Shader::ConvertShaderToMaterial(aiMaterial *, const ShaderDataBlock &)"
               );
}

Assistant:

void Q3Shader::ConvertShaderToMaterial(aiMaterial* out, const ShaderDataBlock& shader)
{
    ai_assert(NULL != out);

    /*  IMPORTANT: This is not a real conversion. Actually we're just guessing and
     *  hacking around to build an aiMaterial that looks nearly equal to the
     *  original Quake 3 shader. We're missing some important features like
     *  animatable material properties in our material system, but at least
     *  multiple textures should be handled correctly.
     */

    // Two-sided material?
    if (shader.cull == Q3Shader::CULL_NONE) {
        const int twosided = 1;
        out->AddProperty(&twosided,1,AI_MATKEY_TWOSIDED);
    }

    unsigned int cur_emissive = 0, cur_diffuse = 0, cur_lm =0;

    // Iterate through all textures
    for (std::list< Q3Shader::ShaderMapBlock >::const_iterator it = shader.maps.begin(); it != shader.maps.end();++it) {

        // CONVERSION BEHAVIOUR:
        //
        //
        // If the texture is additive
        //  - if it is the first texture, assume additive blending for the whole material
        //  - otherwise register it as emissive texture.
        //
        // If the texture is using standard blend (or if the blend mode is unknown)
        //  - if first texture: assume default blending for material
        //  - in any case: set it as diffuse texture
        //
        // If the texture is using 'filter' blending
        //  - take as lightmap
        //
        // Textures with alpha funcs
        //  - aiTextureFlags_UseAlpha is set (otherwise aiTextureFlags_NoAlpha is explicitly set)
        aiString s((*it).name);
        aiTextureType type; unsigned int index;

        if ((*it).blend_src == Q3Shader::BLEND_GL_ONE && (*it).blend_dest == Q3Shader::BLEND_GL_ONE) {
            if (it == shader.maps.begin()) {
                const int additive = aiBlendMode_Additive;
                out->AddProperty(&additive,1,AI_MATKEY_BLEND_FUNC);

                index = cur_diffuse++;
                type  = aiTextureType_DIFFUSE;
            }
            else {
                index = cur_emissive++;
                type  = aiTextureType_EMISSIVE;
            }
        }
        else if ((*it).blend_src == Q3Shader::BLEND_GL_DST_COLOR && (*it).blend_dest == Q3Shader::BLEND_GL_ZERO) {
            index = cur_lm++;
            type  = aiTextureType_LIGHTMAP;
        }
        else {
            const int blend = aiBlendMode_Default;
            out->AddProperty(&blend,1,AI_MATKEY_BLEND_FUNC);

            index = cur_diffuse++;
            type  = aiTextureType_DIFFUSE;
        }

        // setup texture
        out->AddProperty(&s,AI_MATKEY_TEXTURE(type,index));

        // setup texture flags
        const int use_alpha = ((*it).alpha_test != Q3Shader::AT_NONE ? aiTextureFlags_UseAlpha : aiTextureFlags_IgnoreAlpha);
        out->AddProperty(&use_alpha,1,AI_MATKEY_TEXFLAGS(type,index));
    }
    // If at least one emissive texture was set, set the emissive base color to 1 to ensure
    // the texture is actually displayed.
    if (0 != cur_emissive) {
        aiColor3D one(1.f,1.f,1.f);
        out->AddProperty(&one,1,AI_MATKEY_COLOR_EMISSIVE);
    }
}